

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void generate_stats(int *st,int *spent,int *inc,int *left)

{
  player_class *ppVar1;
  _Bool _Var2;
  wchar_t wVar3;
  int iVar4;
  uint *points_inc_local;
  int *points_inc_local_00;
  int *points_spent_local;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  int *points_spent_local_00;
  int *extraout_RDX_02;
  int *points_spent_local_01;
  int *extraout_RDX_03;
  int iVar5;
  byte bVar6;
  int *in_R8;
  undefined1 in_R9B;
  byte bVar7;
  wchar_t wVar8;
  int iVar9;
  byte local_54 [8];
  wchar_t local_4c;
  long local_48;
  int local_3c;
  int local_38;
  wchar_t local_34;
  
  local_54[0] = 0;
  local_54[1] = 0;
  local_54[2] = 0;
  local_54[3] = 0;
  local_54[4] = 0;
  ppVar1 = player->class;
  local_4c = L'\0';
  if ((ppVar1->magic).total_spells != L'\0') {
    local_4c = ((ppVar1->magic).books)->realm->stat;
  }
  local_34 = ppVar1->max_attacks;
  points_spent_local = (int *)(ulong)(uint)local_34;
  local_48 = (long)local_4c;
  local_38 = (local_34 < L'\x05') + 1 + (uint)(local_34 < L'\x05');
  iVar5 = 10;
  bVar6 = 0;
  local_3c = 10;
  iVar4 = 0;
  do {
    iVar9 = iVar4;
    if ((points_left == L'\0') || (iVar9 < 0)) {
      wVar8 = L'\x00296880';
      event_signal_birthpoints(points_spent,points_inc,points_left);
      recalculate_stats((int *)(ulong)(uint)points_left,wVar8);
      return;
    }
    points_inc_local = &switchD_001a9008::switchdataD_002227c0;
    iVar4 = -1;
    switch(iVar9) {
    case 0:
      iVar4 = local_38;
      if ((local_54[0] == 0) && (stats[0] < 0x11)) {
        _Var2 = buy_stat(L'\0',(int *)0x0,points_spent_local,
                         (int *)&switchD_001a9008::switchdataD_002227c0,in_R8,(_Bool)in_R9B);
        points_spent_local = extraout_RDX;
        iVar4 = 0;
        if (!_Var2) {
          local_54[0] = 1;
        }
      }
      break;
    case 1:
      iVar4 = 2;
      if ((local_54[3] == '\0') && (stats[3] < 0x11)) {
        _Var2 = buy_stat(L'\x03',(int *)0x1,points_spent_local,
                         (int *)&switchD_001a9008::switchdataD_002227c0,in_R8,(_Bool)in_R9B);
        if (!_Var2) {
          local_54[3] = 1;
        }
        wVar8 = (player->state).num_blows;
        iVar4 = wVar8 / 10;
        points_spent_local = (int *)((long)wVar8 % 10 & 0xffffffff);
        if (local_3c < iVar4) {
          local_3c = iVar4;
          iVar5 = stats[3];
        }
        iVar4 = 1;
      }
      break;
    case 2:
      bVar7 = local_54[3];
      while (iVar5 < stats[3]) {
        bVar7 = '\0';
        sell_stat(L'\x03',(int *)0x0,points_spent_local,(int *)points_inc_local,in_R8,(_Bool)in_R9B)
        ;
        points_spent_local = extraout_RDX_01;
      }
      local_54[3] = bVar7;
      iVar4 = 3;
      break;
    case 3:
      points_inc_local_00 = (int *)0x2;
      wVar3 = points_left / 2;
      points_spent_local = (int *)((long)points_left % 2 & 0xffffffff);
      wVar8 = points_left;
      if (local_34 < L'\x06') {
        bVar6 = local_54[local_48];
        while (((bVar6 & 1) == 0 &&
               (((local_34 < L'\x05' || (points_inc_local_00 = stats, stats[local_48] < 0x12)) &&
                (points_inc_local_00 = points_spent, points_spent[local_48] < wVar3))))) {
          _Var2 = buy_stat(local_4c,(int *)0x0,points_spent_local,points_spent,in_R8,(_Bool)in_R9B);
          if (!_Var2) {
            bVar6 = 1;
          }
          points_inc_local_00 = points_spent;
          points_spent_local = points_spent_local_00;
          if (wVar3 < points_spent[local_48]) {
            sell_stat(local_4c,(int *)0x0,points_spent_local_00,points_spent,in_R8,(_Bool)in_R9B);
            bVar6 = 1;
            points_spent_local = extraout_RDX_02;
          }
        }
        local_54[local_48] = bVar6;
        bVar6 = local_54[4];
        wVar8 = wVar3;
      }
      while ((((bVar6 & 1) == 0 && (stats[4] < 0x10)) && (points_spent[4] < wVar8))) {
        _Var2 = buy_stat(L'\x04',(int *)0x0,points_spent_local,points_inc_local_00,in_R8,
                         (_Bool)in_R9B);
        if (!_Var2) {
          bVar6 = 1;
        }
        points_spent_local = points_spent_local_01;
        if (wVar8 < points_spent[4]) {
          sell_stat(L'\x04',(int *)0x0,points_spent_local_01,points_inc_local_00,in_R8,(_Bool)in_R9B
                   );
          bVar6 = 1;
          points_spent_local = extraout_RDX_03;
        }
      }
      local_54[4] = bVar6;
      iVar4 = 4;
      break;
    case 4:
      wVar8 = L'\x03';
      if ((local_54[3] == '\x01') &&
         ((local_54[1] != '\0' || (wVar8 = L'\x01', local_4c == L'\x01')))) {
        iVar4 = 5;
        if ((local_54[2] != '\0') || (wVar8 = L'\x02', local_4c == L'\x02')) break;
      }
      do {
        _Var2 = buy_stat(wVar8,(int *)0x0,points_spent_local,(int *)points_inc_local,in_R8,
                         (_Bool)in_R9B);
        points_spent_local = extraout_RDX_00;
      } while (_Var2);
      local_54[(uint)wVar8] = 1;
      iVar4 = 4;
      break;
    }
  } while( true );
}

Assistant:

static void generate_stats(int st[STAT_MAX], int spent[STAT_MAX],
		int inc[STAT_MAX], int *left)
{
	int step = 0;
	bool maxed[STAT_MAX] = { 0 };
	/* Hack - for now, just use stat of first book - NRM */
	int spell_stat = player->class->magic.total_spells ?
		player->class->magic.books[0].realm->stat : 0;
	bool caster = player->class->max_attacks < 5 ? true : false;
	bool warrior = player->class->max_attacks > 5 ? true : false;
	int blows = 10;
	int dex_break = 10;

	while (*left && step >= 0) {
	
		switch (step) {
		
			/* Buy base STR 17 */
			case 0: {
			
				if (!maxed[STAT_STR] && st[STAT_STR] < 17) {
					if (!buy_stat(STAT_STR, st, spent, inc,
							left, false))
						maxed[STAT_STR] = true;
				} else {
					step++;
					
					/* If pure caster skip to step 3 */
					if (caster) {
						step = 3;
					}
				}

				break;
			}

			/* Buy base DEX of 17, record best breakpoint */
			case 1: {
				if (!maxed[STAT_DEX] && st[STAT_DEX] < 17) {
					if (!buy_stat(STAT_DEX, st, spent, inc,
							left, true)) {
						maxed[STAT_DEX] = true;
					}
					if (player->state.num_blows / 10 > blows) {
						blows = player->state.num_blows / 10;
						dex_break = st[STAT_DEX];
					}
				} else {
					step++;
				}

				break;
			}

			/* Sell back DEX that isn't getting us an extra blow. */
			case 2: {
				while (st[STAT_DEX] > dex_break) {
					sell_stat(STAT_DEX, st, spent, inc,
						left, false);
					maxed[STAT_DEX] = false;
				}
				step++;
				break;
			}

			/* 
			 * Spend up to half remaining points on each of spell-stat and 
			 * con, but only up to max base of 16 unless a pure class 
			 * [caster or warrior]
			 */
			case 3: 
			{
				int points_trigger = *left / 2;
				
				if (warrior) {
					points_trigger = *left;
				} else {
					while (!maxed[spell_stat] &&
						   (caster || st[spell_stat] < 18) &&
						   spent[spell_stat] < points_trigger) {

						if (!buy_stat(spell_stat, st,
								spent, inc,
								left, false)) {
							maxed[spell_stat] = true;
						}

						if (spent[spell_stat] > points_trigger) {
						
							sell_stat(spell_stat,
								st, spent, inc,
								left, false);
							maxed[spell_stat] = true;
						}
					}
				}

				while (!maxed[STAT_CON] &&
					   st[STAT_CON] < 16 &&
					   spent[STAT_CON] < points_trigger) {
					   
					if (!buy_stat(STAT_CON, st, spent, inc,
							left, false)) {
						maxed[STAT_CON] = true;
					}

					if (spent[STAT_CON] > points_trigger) {
						sell_stat(STAT_CON, st, spent,
							inc, left, false);
						maxed[STAT_CON] = true;
					}
				}
				
				step++;
				break;
			}

			/* 
			 * If there are any points left, spend as much as possible in 
			 * order on DEX, and the non-spell-stat. 
			 */
			case 4:{
			
				int next_stat;

				if (!maxed[STAT_DEX]) {
					next_stat = STAT_DEX;
				} else if (!maxed[STAT_INT] && spell_stat != STAT_INT) {
					next_stat = STAT_INT;
				} else if (!maxed[STAT_WIS] && spell_stat != STAT_WIS) {
					next_stat = STAT_WIS;
				} else {
					step++;
					break;
				}

				/* Buy until we can't buy any more. */
				while (buy_stat(next_stat, st, spent, inc, left,
						false));
				maxed[next_stat] = true;

				break;
			}

			default: {
			
				step = -1;
				break;
			}
		}
	}
	/* Tell the UI the new points situation. */
	event_signal_birthpoints(spent, inc, *left);

	/* Recalculate everything that's changed because
	   the stat has changed, and inform the UI. */
	recalculate_stats(st, *left);
}